

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_12::NameApplier::VisitElemSegment
          (NameApplier *this,Index elem_segment_index,ElemSegment *segment)

{
  bool bVar1;
  Result RVar2;
  reference pEVar3;
  ElemExpr *elem_expr;
  iterator __end2;
  iterator __begin2;
  ElemExprVector *__range2;
  ElemSegment *segment_local;
  Index elem_segment_index_local;
  NameApplier *this_local;
  
  RVar2 = UseNameForTableVar(this,&segment->table_var);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = ExprVisitor::VisitExprList(&this->visitor_,&segment->offset);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      __end2 = std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::begin
                         (&segment->elem_exprs);
      elem_expr = (ElemExpr *)
                  std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>::end
                            (&segment->elem_exprs);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
                                         *)&elem_expr), bVar1) {
        pEVar3 = __gnu_cxx::
                 __normal_iterator<wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
                 ::operator*(&__end2);
        if (pEVar3->kind == RefFunc) {
          RVar2 = UseNameForFuncVar(this,&pEVar3->var);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        __gnu_cxx::
        __normal_iterator<wabt::ElemExpr_*,_std::vector<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>_>
        ::operator++(&__end2);
      }
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::VisitElemSegment(Index elem_segment_index,
                                     ElemSegment* segment) {
  CHECK_RESULT(UseNameForTableVar(&segment->table_var));
  CHECK_RESULT(visitor_.VisitExprList(segment->offset));
  for (ElemExpr& elem_expr : segment->elem_exprs) {
    if (elem_expr.kind == ElemExprKind::RefFunc) {
      CHECK_RESULT(UseNameForFuncVar(&elem_expr.var));
    }
  }
  return Result::Ok;
}